

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O3

void __thiscall
CTB<UFPC>::PerformLabelingMem
          (CTB<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  Mat1b *pMVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  pointer piVar8;
  CTB<UFPC> *pCVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar10;
  uint uVar11;
  long lVar12;
  uint *puVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  undefined4 uVar28;
  long lVar29;
  double dVar30;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_2b8 [104];
  Mat local_250 [16];
  long local_240;
  long *local_208;
  long local_1f0;
  undefined1 local_1e8 [104];
  Mat local_180 [16];
  long local_170;
  long *local_138;
  CTB<UFPC> *local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_118;
  Size local_110;
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  local_118 = accesses;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1e8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110.height = (int)uVar2;
  local_110.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2b8,&local_110,0);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UFPC::MemAlloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  UFPC::length_ = 1;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar19 = (ulong)*(int *)&pMVar4->field_0x8;
  local_120 = this;
  if (0 < (long)uVar19) {
    uVar11 = *(uint *)&pMVar4->field_0xc;
    lVar12 = (long)(int)uVar11;
    uVar26 = 0;
    do {
      if (0 < (int)uVar11) {
        lVar18 = uVar26 - 1;
        uVar17 = uVar26 | 1;
        uVar28 = 0xffffffff;
        uVar25 = 0;
        iVar24 = -1;
        do {
          switch(uVar28) {
          case 1:
            lVar23 = *local_138;
            piVar1 = (int *)(lVar23 * uVar26 + local_170 + uVar25 * 4);
            *piVar1 = *piVar1 + 1;
            lVar27 = *(long *)local_1e8._80_8_;
            if (*(char *)(uVar25 + lVar27 * uVar26 + local_1e8._24_8_) == '\0') {
              uVar28 = 1;
              if ((uVar17 < uVar19) &&
                 (piVar1 = (int *)(local_170 + lVar23 * uVar17 + uVar25 * 4), *piVar1 = *piVar1 + 1,
                 uVar21 = UFPC::length_,
                 *(char *)(uVar25 + local_1e8._24_8_ + lVar27 * uVar17) != '\0')) {
                lVar23 = (long)(int)UFPC::length_;
                UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar23] =
                     UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar23] + 1;
                UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar23] = uVar21;
                uVar21 = UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
                piVar1 = (int *)(*local_208 * uVar17 + local_240 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar23 = *(long *)local_2b8._80_8_ * uVar17 + local_2b8._24_8_;
                uVar28 = 3;
                goto LAB_001aff54;
              }
              break;
            }
            if (uVar26 == 0) {
LAB_001afcae:
              uVar21 = UFPC::length_;
              lVar23 = (long)(int)UFPC::length_;
              UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar23] =
                   UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar23] + 1;
              UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar23] = uVar21;
              uVar21 = UFPC::length_;
              UFPC::length_ = UFPC::length_ + 1;
              piVar1 = (int *)(*local_208 * uVar26 + local_240 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2b8._80_8_ * uVar26 + local_2b8._24_8_ + uVar25 * 4) = uVar21
              ;
LAB_001afd03:
              iVar24 = 6;
            }
            else {
              lVar23 = local_170 + lVar23 * lVar18;
              piVar1 = (int *)(lVar23 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              lVar27 = local_1e8._24_8_ + lVar27 * lVar18;
              if (*(char *)(uVar25 + lVar27) == '\0') {
                if ((lVar12 <= (long)(uVar25 + 1)) ||
                   (piVar1 = (int *)(lVar23 + 4 + uVar25 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar27 + 1 + uVar25) == '\0')) {
                  if ((uVar25 == 0) ||
                     (piVar1 = (int *)(lVar23 + -4 + uVar25 * 4), *piVar1 = *piVar1 + 1,
                     *(char *)(lVar27 + -1 + uVar25) == '\0')) goto LAB_001afcae;
                  lVar23 = *local_208;
                  piVar1 = (int *)(lVar23 * lVar18 + local_240 + -4 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar27 = *(long *)local_2b8._80_8_;
                  uVar28 = *(undefined4 *)(lVar27 * lVar18 + local_2b8._24_8_ + -4 + uVar25 * 4);
                  piVar1 = (int *)(lVar23 * uVar26 + local_240 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar27 * uVar26 + local_2b8._24_8_ + uVar25 * 4) = uVar28;
                  goto LAB_001afd03;
                }
                lVar14 = *local_208;
                lVar20 = lVar14 * lVar18 + local_240;
                piVar1 = (int *)(lVar20 + 4 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar22 = *(long *)local_2b8._80_8_;
                lVar29 = lVar22 * lVar18 + local_2b8._24_8_;
                uVar28 = *(undefined4 *)(lVar29 + 4 + uVar25 * 4);
                lVar14 = lVar14 * uVar26 + local_240;
                piVar1 = (int *)(lVar14 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar22 = lVar22 * uVar26 + local_2b8._24_8_;
                *(undefined4 *)(lVar22 + uVar25 * 4) = uVar28;
                iVar24 = 5;
                if ((uVar25 != 0) &&
                   (piVar1 = (int *)(lVar23 + -4 + uVar25 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar27 + -1 + uVar25) != '\0')) {
                  piVar1 = (int *)(lVar14 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar21 = *(uint *)(lVar22 + uVar25 * 4);
                  piVar1 = (int *)(lVar20 + -4 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  UFPC::MemMerge(uVar21,*(uint *)(lVar29 + -4 + uVar25 * 4));
                }
              }
              else {
                lVar23 = *local_208;
                piVar1 = (int *)(lVar23 * lVar18 + local_240 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar27 = *(long *)local_2b8._80_8_;
                uVar28 = *(undefined4 *)(lVar27 * lVar18 + local_2b8._24_8_ + uVar25 * 4);
                piVar1 = (int *)(lVar23 * uVar26 + local_240 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar27 * uVar26 + local_2b8._24_8_ + uVar25 * 4) = uVar28;
                iVar24 = 4;
              }
            }
            uVar28 = 2;
            if ((uVar19 <= uVar17) ||
               (piVar1 = (int *)(*local_138 * uVar17 + local_170 + uVar25 * 4),
               *piVar1 = *piVar1 + 1,
               *(char *)(uVar25 + *(long *)local_1e8._80_8_ * uVar17 + local_1e8._24_8_) == '\0'))
            break;
            lVar23 = *local_208;
            piVar1 = (int *)(lVar23 * uVar26 + local_240 + uVar25 * 4);
            *piVar1 = *piVar1 + 1;
            lVar27 = *(long *)local_2b8._80_8_;
            uVar21 = *(uint *)(lVar27 * uVar26 + local_2b8._24_8_ + uVar25 * 4);
            piVar1 = (int *)(lVar23 * uVar17 + local_240 + uVar25 * 4);
            *piVar1 = *piVar1 + 1;
            lVar23 = lVar27 * uVar17 + local_2b8._24_8_;
            uVar28 = 2;
            goto LAB_001aff54;
          case 2:
            lVar23 = *local_138;
            piVar1 = (int *)(lVar23 * uVar26 + local_170 + uVar25 * 4);
            *piVar1 = *piVar1 + 1;
            lVar27 = *(long *)local_1e8._80_8_;
            if (*(char *)(uVar25 + lVar27 * uVar26 + local_1e8._24_8_) == '\0') goto LAB_001af3f9;
            uVar28 = 2;
            if (iVar24 == 6) {
LAB_001af481:
              lVar22 = *local_208;
              local_1f0 = local_240;
              lVar29 = lVar22 * uVar26 + local_240;
              piVar1 = (int *)(lVar29 + -4 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = *(long *)local_2b8._80_8_;
              lVar20 = lVar14 * uVar26 + local_2b8._24_8_;
              uVar3 = *(undefined4 *)(lVar20 + -4 + uVar25 * 4);
              piVar1 = (int *)(lVar29 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar20 + uVar25 * 4) = uVar3;
              iVar24 = 6;
              if (((uVar26 != 0) && ((long)(uVar25 + 1) < lVar12)) &&
                 (piVar1 = (int *)(local_170 + lVar23 * lVar18 + 4 + uVar25 * 4),
                 *piVar1 = *piVar1 + 1,
                 *(char *)(uVar25 + 1 + local_1e8._24_8_ + lVar27 * lVar18) != '\0')) {
                piVar1 = (int *)(lVar29 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                uVar21 = *(uint *)(lVar20 + uVar25 * 4);
                piVar1 = (int *)(local_240 + lVar22 * lVar18 + 4 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
LAB_001af536:
                UFPC::MemMerge(uVar21,*(uint *)(local_2b8._24_8_ + lVar14 * lVar18 + 4 + uVar25 * 4)
                              );
                iVar24 = 5;
              }
            }
            else if (iVar24 == 5) {
LAB_001af3ae:
              lVar23 = *local_208 * uVar26 + local_240;
              piVar1 = (int *)(lVar23 + -4 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              lVar27 = *(long *)local_2b8._80_8_ * uVar26 + local_2b8._24_8_;
              uVar28 = *(undefined4 *)(lVar27 + -4 + uVar25 * 4);
              piVar1 = (int *)(lVar23 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar27 + uVar25 * 4) = uVar28;
              iVar24 = 5;
              uVar28 = 5;
            }
            else if (iVar24 == 4) {
              lVar22 = *local_208;
              lVar20 = lVar22 * uVar26 + local_240;
              piVar1 = (int *)(lVar20 + -4 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = *(long *)local_2b8._80_8_;
              lVar29 = lVar14 * uVar26 + local_2b8._24_8_;
              uVar28 = *(undefined4 *)(lVar29 + -4 + uVar25 * 4);
              piVar1 = (int *)(lVar20 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar29 + uVar25 * 4) = uVar28;
              iVar24 = 6;
              if (uVar26 == 0) goto LAB_001afc36;
              lVar16 = local_170 + lVar23 * lVar18;
              piVar1 = (int *)(lVar16 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              lVar23 = local_1e8._24_8_ + lVar27 * lVar18;
              uVar28 = 4;
              if (*(char *)(uVar25 + lVar23) == '\0') {
                if (((long)(uVar25 + 1) < lVar12) &&
                   (piVar1 = (int *)(lVar16 + 4 + uVar25 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar23 + 1 + uVar25) != '\0')) {
                  piVar1 = (int *)(lVar20 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar21 = *(uint *)(lVar29 + uVar25 * 4);
                  piVar1 = (int *)(local_240 + lVar22 * lVar18 + 4 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  goto LAB_001af536;
                }
              }
              else {
LAB_001af343:
                uVar28 = 4;
                iVar24 = 4;
              }
            }
LAB_001afec3:
            if ((uVar17 < uVar19) &&
               (piVar1 = (int *)(*local_138 * uVar17 + local_170 + uVar25 * 4),
               *piVar1 = *piVar1 + 1,
               *(char *)(uVar25 + *(long *)local_1e8._80_8_ * uVar17 + local_1e8._24_8_) != '\0')) {
              lVar23 = *local_208;
              piVar1 = (int *)(lVar23 * uVar26 + local_240 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              lVar27 = *(long *)local_2b8._80_8_;
              uVar21 = *(uint *)(lVar27 * uVar26 + local_2b8._24_8_ + uVar25 * 4);
              piVar1 = (int *)(lVar23 * uVar17 + local_240 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              lVar23 = lVar27 * uVar17 + local_2b8._24_8_;
              goto LAB_001aff54;
            }
            break;
          case 3:
          case 7:
          case 9:
            lVar23 = *local_138;
            piVar1 = (int *)(lVar23 * uVar26 + local_170 + uVar25 * 4);
            *piVar1 = *piVar1 + 1;
            lVar27 = *(long *)local_1e8._80_8_;
            if (*(char *)(uVar25 + lVar27 * uVar26 + local_1e8._24_8_) == '\0') {
              uVar28 = 1;
              if ((uVar17 < uVar19) &&
                 (piVar1 = (int *)(local_170 + lVar23 * uVar17 + uVar25 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(uVar25 + local_1e8._24_8_ + lVar27 * uVar17) != '\0')) {
                lVar27 = *local_208 * uVar17 + local_240;
                piVar1 = (int *)(lVar27 + -4 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar23 = *(long *)local_2b8._80_8_ * uVar17 + local_2b8._24_8_;
                uVar21 = *(uint *)(lVar23 + -4 + uVar25 * 4);
                piVar1 = (int *)(lVar27 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                uVar28 = 9;
                goto LAB_001aff54;
              }
            }
            else {
              if (uVar26 == 0) {
LAB_001af69e:
                lVar14 = *local_208;
                piVar1 = (int *)(lVar14 * uVar17 + local_240 + -4 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar22 = *(long *)local_2b8._80_8_;
                uVar28 = *(undefined4 *)(lVar22 * uVar17 + local_2b8._24_8_ + -4 + uVar25 * 4);
                lVar20 = lVar14 * uVar26 + local_240;
                piVar1 = (int *)(lVar20 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar29 = lVar22 * uVar26 + local_2b8._24_8_;
                *(undefined4 *)(lVar29 + uVar25 * 4) = uVar28;
                iVar24 = 6;
                if ((uVar25 != 0 && uVar26 != 0) &&
                   (piVar1 = (int *)(local_170 + lVar23 * lVar18 + -4 + uVar25 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)((uVar25 - 1) + local_1e8._24_8_ + lVar27 * lVar18) != '\0')) {
                  piVar1 = (int *)(lVar20 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar21 = *(uint *)(lVar29 + uVar25 * 4);
                  piVar1 = (int *)(local_240 + lVar14 * lVar18 + -4 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  puVar13 = (uint *)(local_2b8._24_8_ + lVar22 * lVar18 + (uVar25 - 1) * 4);
LAB_001af763:
                  UFPC::MemMerge(uVar21,*puVar13);
                }
              }
              else {
                lVar14 = lVar23 * lVar18 + local_170;
                piVar1 = (int *)(lVar14 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar22 = lVar27 * lVar18 + local_1e8._24_8_;
                if (*(char *)(uVar25 + lVar22) != '\0') {
                  lVar23 = *local_208;
                  piVar1 = (int *)(lVar23 * lVar18 + local_240 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar27 = *(long *)local_2b8._80_8_;
                  uVar28 = *(undefined4 *)(lVar27 * lVar18 + local_2b8._24_8_ + uVar25 * 4);
                  lVar14 = lVar23 * uVar26 + local_240;
                  piVar1 = (int *)(lVar14 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar22 = lVar27 * uVar26 + local_2b8._24_8_;
                  *(undefined4 *)(lVar22 + uVar25 * 4) = uVar28;
                  piVar1 = (int *)(lVar14 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar21 = *(uint *)(lVar22 + uVar25 * 4);
                  piVar1 = (int *)(lVar23 * uVar17 + local_240 + -4 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  puVar13 = (uint *)(lVar27 * uVar17 + local_2b8._24_8_ + uVar25 * 4 + -4);
                  iVar24 = 4;
                  goto LAB_001af763;
                }
                if ((lVar12 <= (long)(uVar25 + 1)) ||
                   (piVar1 = (int *)(lVar14 + 4 + uVar25 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar22 + 1 + uVar25) == '\0')) goto LAB_001af69e;
                lVar23 = *local_208;
                piVar1 = (int *)(lVar23 * lVar18 + local_240 + 4 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar27 = *(long *)local_2b8._80_8_;
                uVar28 = *(undefined4 *)(lVar27 * lVar18 + local_2b8._24_8_ + 4 + uVar25 * 4);
                lVar14 = lVar23 * uVar26 + local_240;
                piVar1 = (int *)(lVar14 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar22 = lVar27 * uVar26 + local_2b8._24_8_;
                *(undefined4 *)(lVar22 + uVar25 * 4) = uVar28;
                piVar1 = (int *)(lVar14 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                uVar21 = *(uint *)(lVar22 + uVar25 * 4);
                piVar1 = (int *)(lVar23 * uVar17 + local_240 + -4 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                UFPC::MemMerge(uVar21,*(uint *)(lVar27 * uVar17 + local_2b8._24_8_ + -4 + uVar25 * 4
                                               ));
                iVar24 = 5;
                if ((uVar25 != 0) &&
                   (piVar1 = (int *)(*local_138 * lVar18 + local_170 + -4 + uVar25 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)((uVar25 - 1) + *(long *)local_1e8._80_8_ * lVar18 + local_1e8._24_8_)
                   != '\0')) {
                  lVar23 = *local_208;
                  piVar1 = (int *)(lVar23 * uVar26 + local_240 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar27 = *(long *)local_2b8._80_8_;
                  uVar21 = *(uint *)(lVar27 * uVar26 + local_2b8._24_8_ + uVar25 * 4);
                  piVar1 = (int *)(lVar23 * lVar18 + local_240 + -4 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  puVar13 = (uint *)(lVar27 * lVar18 + local_2b8._24_8_ + (uVar25 - 1) * 4);
                  goto LAB_001af763;
                }
              }
              uVar28 = 8;
              if ((uVar17 < uVar19) &&
                 (piVar1 = (int *)(*local_138 * uVar17 + local_170 + uVar25 * 4),
                 *piVar1 = *piVar1 + 1,
                 *(char *)(uVar25 + *(long *)local_1e8._80_8_ * uVar17 + local_1e8._24_8_) != '\0'))
              {
                lVar23 = *local_208;
                piVar1 = (int *)(lVar23 * uVar26 + local_240 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar27 = *(long *)local_2b8._80_8_;
                uVar21 = *(uint *)(lVar27 * uVar26 + local_2b8._24_8_ + uVar25 * 4);
                piVar1 = (int *)(lVar23 * uVar17 + local_240 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar23 = lVar27 * uVar17 + local_2b8._24_8_;
                uVar28 = 8;
                goto LAB_001aff54;
              }
            }
            break;
          case 4:
            lVar23 = *local_138;
            piVar1 = (int *)(lVar23 * uVar26 + local_170 + uVar25 * 4);
            *piVar1 = *piVar1 + 1;
            lVar27 = *(long *)local_1e8._80_8_;
            if (*(char *)(uVar25 + lVar27 * uVar26 + local_1e8._24_8_) != '\0') {
              uVar28 = 4;
              if (iVar24 == 6) goto LAB_001af481;
              if (iVar24 == 5) goto LAB_001af3ae;
              if (iVar24 == 4) {
                lVar22 = *local_208;
                lVar29 = lVar22 * uVar26 + local_240;
                piVar1 = (int *)(lVar29 + -4 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = *(long *)local_2b8._80_8_;
                lVar20 = lVar14 * uVar26 + local_2b8._24_8_;
                uVar3 = *(undefined4 *)(lVar20 + -4 + uVar25 * 4);
                piVar1 = (int *)(lVar29 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar20 + uVar25 * 4) = uVar3;
                iVar24 = 6;
                if (uVar26 != 0) {
LAB_001af31a:
                  iVar24 = 6;
                  lVar16 = local_170 + lVar23 * lVar18;
                  piVar1 = (int *)(lVar16 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar23 = local_1e8._24_8_ + lVar27 * lVar18;
                  uVar28 = 4;
                  if (*(char *)(uVar25 + lVar23) != '\0') goto LAB_001af343;
                  if (((long)(uVar25 + 1) < lVar12) &&
                     (piVar1 = (int *)(lVar16 + 4 + uVar25 * 4), *piVar1 = *piVar1 + 1,
                     *(char *)(lVar23 + 1 + uVar25) != '\0')) {
                    piVar1 = (int *)(lVar29 + uVar25 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar21 = *(uint *)(lVar20 + uVar25 * 4);
                    piVar1 = (int *)(local_240 + lVar22 * lVar18 + 4 + uVar25 * 4);
                    *piVar1 = *piVar1 + 1;
                    goto LAB_001af536;
                  }
                }
              }
              goto LAB_001afec3;
            }
            goto LAB_001af3f9;
          case 5:
            lVar23 = *local_138;
            piVar1 = (int *)(lVar23 * uVar26 + local_170 + uVar25 * 4);
            *piVar1 = *piVar1 + 1;
            lVar27 = *(long *)local_1e8._80_8_;
            if (*(char *)(uVar25 + lVar27 * uVar26 + local_1e8._24_8_) != '\0') {
              lVar14 = *local_208;
              lVar20 = lVar14 * uVar26 + local_240;
              piVar1 = (int *)(lVar20 + -4 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              lVar22 = *(long *)local_2b8._80_8_;
              lVar29 = lVar22 * uVar26 + local_2b8._24_8_;
              uVar28 = *(undefined4 *)(lVar29 + -4 + uVar25 * 4);
              piVar1 = (int *)(lVar20 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar29 + uVar25 * 4) = uVar28;
              if (uVar26 == 0) {
                iVar24 = 6;
              }
              else {
                lVar23 = local_170 + lVar23 * lVar18;
                piVar1 = (int *)(lVar23 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar27 = local_1e8._24_8_ + lVar27 * lVar18;
                iVar24 = 4;
                if (*(char *)(uVar25 + lVar27) == '\0') {
                  if ((long)(uVar25 + 1) < lVar12) {
                    piVar1 = (int *)(lVar23 + 4 + uVar25 * 4);
                    *piVar1 = *piVar1 + 1;
                    iVar24 = 6;
                    if (*(char *)(lVar27 + 1 + uVar25) != '\0') {
                      piVar1 = (int *)(lVar20 + uVar25 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar21 = *(uint *)(lVar29 + uVar25 * 4);
                      piVar1 = (int *)(local_240 + lVar14 * lVar18 + 4 + uVar25 * 4);
                      *piVar1 = *piVar1 + 1;
                      UFPC::MemMerge(uVar21,*(uint *)(local_2b8._24_8_ + lVar22 * lVar18 + 4 +
                                                     uVar25 * 4));
                      iVar24 = 5;
                    }
                  }
                  else {
                    iVar24 = 6;
                  }
                }
              }
              uVar28 = 4;
              if ((uVar17 < uVar19) &&
                 (piVar1 = (int *)(*local_138 * uVar17 + local_170 + uVar25 * 4),
                 *piVar1 = *piVar1 + 1,
                 *(char *)(uVar25 + *(long *)local_1e8._80_8_ * uVar17 + local_1e8._24_8_) != '\0'))
              {
                lVar23 = *local_208;
                piVar1 = (int *)(lVar23 * uVar26 + local_240 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar27 = *(long *)local_2b8._80_8_;
                uVar21 = *(uint *)(lVar27 * uVar26 + local_2b8._24_8_ + uVar25 * 4);
                piVar1 = (int *)(lVar23 * uVar17 + local_240 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar23 = lVar27 * uVar17 + local_2b8._24_8_;
                uVar28 = 4;
                goto LAB_001aff54;
              }
              break;
            }
            uVar28 = 1;
            if ((uVar19 <= uVar17) ||
               (piVar1 = (int *)(local_170 + lVar23 * uVar17 + uVar25 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(uVar25 + local_1e8._24_8_ + lVar27 * uVar17) == '\0')) break;
            goto LAB_001af426;
          case 6:
            lVar23 = *local_138;
            piVar1 = (int *)(lVar23 * uVar26 + local_170 + uVar25 * 4);
            *piVar1 = *piVar1 + 1;
            lVar27 = *(long *)local_1e8._80_8_;
            if (*(char *)(uVar25 + lVar27 * uVar26 + local_1e8._24_8_) != '\0') {
              if (iVar24 == 6) {
                lVar14 = *local_208;
                lVar20 = lVar14 * uVar26 + local_240;
                piVar1 = (int *)(lVar20 + -4 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar22 = *(long *)local_2b8._80_8_;
                lVar29 = lVar22 * uVar26 + local_2b8._24_8_;
                uVar28 = *(undefined4 *)(lVar29 + -4 + uVar25 * 4);
                piVar1 = (int *)(lVar20 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar29 + uVar25 * 4) = uVar28;
                uVar28 = 6;
                if ((uVar26 == 0) || (lVar12 <= (long)(uVar25 + 1))) {
                  iVar24 = 6;
                }
                else {
                  piVar1 = (int *)(local_170 + lVar23 * lVar18 + 4 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar25 + 1 + local_1e8._24_8_ + lVar27 * lVar18) == '\0') {
                    iVar24 = 6;
                  }
                  else {
                    piVar1 = (int *)(lVar20 + uVar25 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar21 = *(uint *)(lVar29 + uVar25 * 4);
                    piVar1 = (int *)(local_240 + lVar14 * lVar18 + 4 + uVar25 * 4);
                    *piVar1 = *piVar1 + 1;
                    UFPC::MemMerge(uVar21,*(uint *)(local_2b8._24_8_ + lVar22 * lVar18 + 4 +
                                                   uVar25 * 4));
                    iVar24 = 5;
                  }
                }
              }
              else {
                uVar28 = 6;
                if (iVar24 == 5) goto LAB_001af3ae;
              }
              goto LAB_001afec3;
            }
            goto LAB_001af3f9;
          case 8:
            lVar23 = *local_138;
            piVar1 = (int *)(lVar23 * uVar26 + local_170 + uVar25 * 4);
            *piVar1 = *piVar1 + 1;
            lVar27 = *(long *)local_1e8._80_8_;
            if (*(char *)(uVar25 + lVar27 * uVar26 + local_1e8._24_8_) != '\0') {
              uVar28 = 8;
              if (iVar24 == 6) goto LAB_001af481;
              if (iVar24 == 5) goto LAB_001af3ae;
              if (iVar24 == 4) {
                lVar22 = *local_208;
                lVar29 = lVar22 * uVar26 + local_240;
                piVar1 = (int *)(lVar29 + -4 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = *(long *)local_2b8._80_8_;
                lVar20 = lVar14 * uVar26 + local_2b8._24_8_;
                uVar28 = *(undefined4 *)(lVar20 + -4 + uVar25 * 4);
                piVar1 = (int *)(lVar29 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar20 + uVar25 * 4) = uVar28;
                if (uVar26 != 0) goto LAB_001af31a;
LAB_001afc36:
                iVar24 = 6;
                uVar28 = 4;
              }
              goto LAB_001afec3;
            }
LAB_001af3f9:
            uVar28 = 1;
            if ((uVar17 < uVar19) &&
               (piVar1 = (int *)(local_170 + lVar23 * uVar17 + uVar25 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(uVar25 + local_1e8._24_8_ + lVar27 * uVar17) != '\0')) {
LAB_001af426:
              lVar23 = *local_208;
              piVar1 = (int *)(lVar23 * uVar26 + local_240 + -4 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
              lVar27 = *(long *)local_2b8._80_8_;
              uVar21 = *(uint *)(lVar27 * uVar26 + local_2b8._24_8_ + -4 + uVar25 * 4);
              piVar1 = (int *)(lVar23 * uVar17 + local_240 + uVar25 * 4);
              *piVar1 = *piVar1 + 1;
LAB_001af476:
              lVar23 = lVar27 * uVar17 + local_2b8._24_8_;
              uVar28 = 7;
LAB_001aff54:
              *(uint *)(lVar23 + uVar25 * 4) = uVar21;
            }
            break;
          case 0xffffffff:
            lVar23 = *local_138;
            piVar1 = (int *)(lVar23 * uVar26 + local_170 + uVar25 * 4);
            *piVar1 = *piVar1 + 1;
            lVar27 = *(long *)local_1e8._80_8_;
            if (*(char *)(uVar25 + lVar27 * uVar26 + local_1e8._24_8_) != '\0') {
              if (uVar26 == 0) {
LAB_001afa9b:
                uVar21 = UFPC::length_;
                lVar14 = (long)(int)UFPC::length_;
                UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar14] =
                     UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14] + 1;
                UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar14] = uVar21;
                uVar21 = UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
                lVar14 = *local_208;
                piVar1 = (int *)(lVar14 * uVar26 + local_240 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar22 = *(long *)local_2b8._80_8_;
                iVar24 = 6;
              }
              else {
                lVar14 = lVar23 * lVar18 + local_170;
                piVar1 = (int *)(lVar14 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar22 = lVar27 * lVar18 + local_1e8._24_8_;
                if (*(char *)(uVar25 + lVar22) == '\0') {
                  if ((lVar12 <= (long)(uVar25 + 1)) ||
                     (piVar1 = (int *)(lVar14 + 4 + uVar25 * 4), *piVar1 = *piVar1 + 1,
                     *(char *)(lVar22 + 1 + uVar25) == '\0')) goto LAB_001afa9b;
                  lVar14 = *local_208;
                  piVar1 = (int *)(lVar14 * lVar18 + local_240 + 4 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar22 = *(long *)local_2b8._80_8_;
                  uVar21 = *(uint *)(lVar22 * lVar18 + local_2b8._24_8_ + 4 + uVar25 * 4);
                  piVar1 = (int *)(lVar14 * uVar26 + local_240 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  iVar24 = 5;
                }
                else {
                  lVar14 = *local_208;
                  piVar1 = (int *)(lVar14 * lVar18 + local_240 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar22 = *(long *)local_2b8._80_8_;
                  uVar21 = *(uint *)(lVar22 * lVar18 + local_2b8._24_8_ + uVar25 * 4);
                  piVar1 = (int *)(lVar14 * uVar26 + local_240 + uVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  iVar24 = 4;
                }
              }
              lVar20 = lVar22 * uVar26 + local_2b8._24_8_;
              *(uint *)(lVar20 + uVar25 * 4) = uVar21;
              uVar28 = 2;
              if ((uVar17 < uVar19) &&
                 (piVar1 = (int *)(local_170 + lVar23 * uVar17 + uVar25 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(uVar25 + local_1e8._24_8_ + lVar27 * uVar17) != '\0')) {
                piVar1 = (int *)(lVar14 * uVar26 + local_240 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                uVar21 = *(uint *)(lVar20 + uVar25 * 4);
                piVar1 = (int *)(lVar14 * uVar17 + local_240 + uVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar23 = local_2b8._24_8_ + lVar22 * uVar17;
                uVar28 = 2;
                goto LAB_001aff54;
              }
              break;
            }
            uVar28 = 1;
            if ((uVar19 <= uVar17) ||
               (piVar1 = (int *)(local_170 + lVar23 * uVar17 + uVar25 * 4), *piVar1 = *piVar1 + 1,
               uVar21 = UFPC::length_,
               *(char *)(uVar25 + local_1e8._24_8_ + lVar27 * uVar17) == '\0')) break;
            lVar23 = (long)(int)UFPC::length_;
            UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar23] =
                 UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar23] + 1;
            UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar23] = uVar21;
            uVar21 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
            piVar1 = (int *)(*local_208 * uVar17 + local_240 + uVar25 * 4);
            *piVar1 = *piVar1 + 1;
            lVar27 = *(long *)local_2b8._80_8_;
            goto LAB_001af476;
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar11);
      }
      uVar26 = uVar26 + 2;
    } while (uVar26 < uVar19);
  }
  uVar11 = UFPC::MemFlatten();
  pCVar9 = local_120;
  (local_120->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar11;
  piVar8 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (0 < (int)local_2b8._0_4_) {
    uVar19 = (ulong)(uint)local_2b8._4_4_;
    lVar12 = 0;
    do {
      if (0 < (int)uVar19) {
        lVar23 = *local_208 * lVar12 + local_240;
        lVar18 = *(long *)local_2b8._80_8_ * lVar12 + local_2b8._24_8_;
        lVar27 = 0;
        do {
          piVar1 = (int *)(lVar23 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          iVar24 = *(int *)(lVar18 + lVar27 * 4);
          piVar8[iVar24] = piVar8[iVar24] + 1;
          uVar11 = puVar7[iVar24];
          piVar1 = (int *)(lVar23 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar18 + lVar27 * 4) = uVar11;
          lVar27 = lVar27 + 1;
          uVar19 = (ulong)(int)local_2b8._4_4_;
        } while (lVar27 < (long)uVar19);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)local_2b8._0_4_);
  }
  pauVar15 = (undefined1 (*) [16])operator_new(0x20);
  pvVar10 = local_118;
  pauVar15[1] = (undefined1  [16])0x0;
  *pauVar15 = (undefined1  [16])0x0;
  puVar5 = (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar15;
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar15 + 2);
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar15 + 2);
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)puVar6 - (long)puVar5);
  }
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_180;
  cv::sum((_InputArray *)&local_f0);
  *(pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_f0._0_8_ - 9.223372036854776e+18) & (long)(double)local_f0._0_8_ >> 0x3f
       | (long)(double)local_f0._0_8_;
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_250;
  cv::sum((_InputArray *)&local_f0);
  puVar5 = (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5[1] = (long)((double)local_f0._0_8_ - 9.223372036854776e+18) &
              (long)(double)local_f0._0_8_ >> 0x3f | (long)(double)local_f0._0_8_;
  if ((long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar19 = 0;
  }
  else {
    lVar12 = (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar30 = 0.0;
    lVar18 = 0;
    do {
      dVar30 = dVar30 + (double)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar18);
    uVar19 = (long)(dVar30 - 9.223372036854776e+18) & (long)dVar30 >> 0x3f | (long)dVar30;
  }
  puVar5[2] = uVar19;
  MemMat<int>::GetImage(&local_f0,(MemMat<int> *)local_2b8);
  cv::Mat::operator=(&((pCVar9->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     &local_f0.super_Mat);
  cv::Mat::~Mat(&local_f0.super_Mat);
  cv::Mat::~Mat(local_250);
  cv::Mat::~Mat((Mat *)(local_2b8 + 8));
  cv::Mat::~Mat(local_180);
  cv::Mat::~Mat((Mat *)(local_1e8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img(r,c)>0
#define CONDITION_B r+1<h && img(r + 1, c)>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img(r - 1, c - 1)>0
#define CONDITION_N2 r-1>=0 && img(r - 1, c)>0
#define CONDITION_N3 r-1>=0 && c+1<w && img(r - 1, c + 1)>0
#define CONDITION_N4 c-1>=0 && img(r, c - 1)>0
#define CONDITION_N5 c-1>=0 && r+1<h && img(r + 1, c - 1)>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r, c) = img_labels(r - 1, c - 1); // a <- n1
#define ACTION_4 img_labels(r, c) = img_labels(r - 1, c); // a <- n2
#define ACTION_5 img_labels(r, c) = img_labels(r - 1, c + 1); // a <- n3
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 1); // a <- n4
#define ACTION_7 img_labels(r, c) = img_labels(r + 1, c - 1); // a <- n5
#define ACTION_8 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r - 1, c - 1)); // a + n1
#define ACTION_9 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r - 1, c + 1)); // a + n3
#define ACTION_10 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r + 1, c - 1)); // a + n5
#define ACTION_11 img_labels(r + 1, c) = LabelsSolver::MemNewLabel(); // b new label
#define ACTION_12 img_labels(r + 1, c) = img_labels(r, c - 1); // b <- n4
#define ACTION_13 img_labels(r + 1, c) = img_labels(r + 1, c - 1); // b <- n5
#define ACTION_14 img_labels(r + 1, c) = img_labels(r, c); // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels.rows; ++r_i) {
            for (int c_i = 0; c_i < img_labels.cols; ++c_i) {
                img_labels(r_i,c_i) = LabelsSolver::MemGetLabel(img_labels(r_i, c_i));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
    }